

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uo_cb.c
# Opt level: O3

void uo_cb_prepend_cb(uo_cb *cb,uo_cb *cb_before)

{
  ulong uVar1;
  void **__src;
  size_t sVar2;
  uo_linklist *puVar3;
  uo_linklist *puVar4;
  uo_linklist *puVar5;
  uo_linklist *puVar6;
  void **__ptr;
  size_t sVar7;
  ulong uVar8;
  uo_linklist *puVar9;
  long in_FS_OFFSET;
  
  __src = (cb_before->stack).items;
  sVar2 = (cb_before->stack).count;
  __ptr = (cb->stack).items;
  sVar7 = (cb->stack).count;
  uVar1 = sVar7 + sVar2;
  if ((cb->stack).capacity < uVar1) {
    uVar8 = uVar1 - 1 >> 1 | uVar1 - 1;
    uVar8 = uVar8 >> 2 | uVar8;
    uVar8 = uVar8 >> 4 | uVar8;
    uVar8 = uVar8 >> 8 | uVar8;
    uVar8 = uVar8 >> 0x10 | uVar8;
    uVar8 = uVar8 >> 0x20 | uVar8;
    (cb->stack).capacity = uVar8 + 1;
    __ptr = (void **)realloc(__ptr,uVar8 * 8 + 8);
    (cb->stack).items = __ptr;
    sVar7 = (cb->stack).count;
  }
  memcpy(__ptr + sVar7,__src,sVar2 << 3);
  (cb->stack).count = uVar1;
  for (puVar9 = (cb_before->funclist).prev; puVar9 != &cb_before->funclist; puVar9 = puVar9->prev) {
    puVar3 = puVar9[1].next;
    uo_cb_func_linkpool_grow(0x20);
    puVar4 = *(uo_linklist **)(in_FS_OFFSET + -0x20);
    puVar5 = puVar4->next;
    puVar6 = puVar4->prev;
    puVar5->prev = puVar6;
    puVar6->next = puVar5;
    puVar4->next = (uo_linklist *)0x0;
    puVar4->prev = (uo_linklist *)0x0;
    puVar4[1].next = puVar3;
    puVar3 = (cb->funclist).next;
    puVar5 = puVar3->prev;
    puVar4->prev = puVar5;
    puVar5->next = puVar4;
    puVar4->next = puVar3;
    puVar3->prev = puVar4;
  }
  return;
}

Assistant:

void uo_cb_prepend_cb(
    uo_cb *cb,
    uo_cb *cb_before)
{
    uo_stack_push_arr(&cb->stack, cb_before->stack.items, cb_before->stack.count);

    uo_linklist *link = cb_before->funclist.prev;

    while (link != &cb_before->funclist)
    {
        uo_cb_prepend_func(cb, ((uo_cb_func_linklist *)link)->item);
        link = link->prev;
    }
}